

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

void __thiscall
EnvironmentNAVXYTHETALATTICE::ReadConfiguration(EnvironmentNAVXYTHETALATTICE *this,FILE *fCfg)

{
  double dVar1;
  int iVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  SBPL_Exception *this_00;
  size_t sVar5;
  runtime_error *prVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int dTemp;
  stringstream ss;
  char sTemp [1024];
  char sTemp1 [1024];
  string asStack_9e8 [36];
  uchar local_9c4 [4];
  stringstream local_9c0 [16];
  ostream local_9b0 [376];
  char local_838 [1024];
  char local_438 [11];
  undefined4 uStack_42d;
  undefined1 uStack_429;
  undefined2 uStack_428;
  undefined4 uStack_426;
  undefined1 uStack_422;
  undefined1 uStack_421;
  undefined7 uStack_420;
  undefined1 uStack_419;
  undefined4 local_418;
  
  iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
  if (iVar2 == 1) {
    builtin_strncpy(local_438,"discretizat",0xb);
    uStack_42d = 0x286e6f69;
    uStack_429 = 99;
    uStack_428 = 0x6c65;
    uStack_426 = 0x3a29736c;
    uStack_422 = 0;
    iVar2 = strcmp(local_438,local_838);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_9c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_9b0,"ERROR: configuration file has incorrect format (discretization)",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(local_9b0," Expected ",10);
      sVar5 = strlen(local_438);
      std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_438,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
      sVar5 = strlen(local_838);
      std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_838,sVar5);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_9e8);
      *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
      __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
    if (iVar2 == 1) {
      iVar2 = atoi(local_838);
      (this->EnvNAVXYTHETALATCfg).EnvWidth_c = iVar2;
      iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
      if (iVar2 == 1) {
        iVar2 = atoi(local_838);
        (this->EnvNAVXYTHETALATCfg).EnvHeight_c = iVar2;
        iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
        if (iVar2 == 1) {
          uStack_42d = CONCAT13(uStack_42d._3_1_,0x3a73);
          builtin_strncpy(local_438,"NumThetaDir",0xb);
          iVar2 = strcmp(local_438,local_838);
          if (iVar2 == 0) {
            iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
            if (iVar2 != 1) {
              this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception
                        (this_00,"ERROR: ran out of env file early (NumThetaDirs)");
              goto LAB_00123e64;
            }
            iVar2 = atoi(local_838);
            (this->EnvNAVXYTHETALATCfg).NumThetaDirs = iVar2;
            iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
            if (iVar2 != 1) {
              this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early (obsthresh)")
              ;
              goto LAB_00123e64;
            }
            builtin_strncpy(local_438,"obsthresh:",0xb);
            iVar2 = strcmp(local_438,local_838);
            if (iVar2 != 0) {
              std::__cxx11::stringstream::stringstream(local_9c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_9b0,"ERROR: configuration file has incorrect format",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0," Expected ",10);
              sVar5 = strlen(local_438);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_438,sVar5);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
              sVar5 = strlen(local_838);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_838,sVar5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_9b0,
                         " see existing examples of env files for the right format of heading",0x43)
              ;
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar6,asStack_9e8);
              *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
              __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            builtin_strncpy(local_438,"obsthresh:",0xb);
            iVar2 = strcmp(local_438,local_838);
            if (iVar2 != 0) {
              std::__cxx11::stringstream::stringstream(local_9c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_9b0,"ERROR: configuration file has incorrect format",0x2e);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0," Expected ",10);
              sVar5 = strlen(local_438);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_438,sVar5);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
              sVar5 = strlen(local_838);
              std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_838,sVar5);
              prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar6,asStack_9e8);
              *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
              __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
            (this->EnvNAVXYTHETALATCfg).NumThetaDirs = 0x10;
          }
          iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
          if (iVar2 == 1) {
            iVar2 = atoi(local_838);
            (this->EnvNAVXYTHETALATCfg).obsthresh = (uchar)iVar2;
            iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
            if (iVar2 == 1) {
              builtin_strncpy(local_438,"cost_inscri",0xb);
              uStack_42d = 0x5f646562;
              uStack_429 = 0x74;
              uStack_428 = 0x7268;
              uStack_426 = 0x3a687365;
              uStack_422 = 0;
              iVar2 = strcmp(local_438,local_838);
              if (iVar2 != 0) {
                std::__cxx11::stringstream::stringstream(local_9c0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_9b0,"ERROR: configuration file has incorrect format",0x2e);
                std::__ostream_insert<char,std::char_traits<char>>(local_9b0," Expected ",10);
                sVar5 = strlen(local_438);
                std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_438,sVar5);
                std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
                sVar5 = strlen(local_838);
                std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_838,sVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_9b0,
                           " see existing examples of env files for the right format of heading",
                           0x43);
                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar6,asStack_9e8);
                *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
                __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
              }
              iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
              if (iVar2 == 1) {
                iVar2 = atoi(local_838);
                (this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh = (uchar)iVar2;
                iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                if (iVar2 == 1) {
                  uStack_428 = 0x6372;
                  uStack_426 = 0x63736d75;
                  uStack_422 = 0x72;
                  uStack_421 = 0x69;
                  uStack_420 = 0x7268745f646562;
                  uStack_419 = 0x65;
                  builtin_strncpy(local_438,"cost_possib",0xb);
                  uStack_42d = 0x635f796c;
                  uStack_429 = 0x69;
                  local_418 = 0x3a6873;
                  iVar2 = strcmp(local_438,local_838);
                  if (iVar2 != 0) {
                    std::__cxx11::stringstream::stringstream(local_9c0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_9b0,"ERROR: configuration file has incorrect format",0x2e);
                    std::__ostream_insert<char,std::char_traits<char>>(local_9b0," Expected ",10);
                    sVar5 = strlen(local_438);
                    std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_438,sVar5);
                    std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
                    sVar5 = strlen(local_838);
                    std::__ostream_insert<char,std::char_traits<char>>(local_9b0,local_838,sVar5);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_9b0,
                               " see existing examples of env files for the right format of heading"
                               ,0x43);
                    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::__cxx11::stringbuf::str();
                    std::runtime_error::runtime_error(prVar6,asStack_9e8);
                    *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
                    __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error)
                    ;
                  }
                  iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                  if (iVar2 == 1) {
                    iVar2 = atoi(local_838);
                    (this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh = iVar2;
                    iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                    if (iVar2 == 1) {
                      builtin_strncpy(local_438,"cellsize(me",0xb);
                      uStack_42d = 0x73726574;
                      uStack_429 = 0x29;
                      uStack_428 = 0x3a;
                      iVar2 = strcmp(local_438,local_838);
                      if (iVar2 != 0) {
                        std::__cxx11::stringstream::stringstream(local_9c0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (local_9b0,"ERROR: configuration file has incorrect format",0x2e);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (local_9b0," Expected ",10);
                        sVar5 = strlen(local_438);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (local_9b0,local_438,sVar5);
                        std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
                        sVar5 = strlen(local_838);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (local_9b0,local_838,sVar5);
                        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::__cxx11::stringbuf::str();
                        std::runtime_error::runtime_error(prVar6,asStack_9e8);
                        *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
                        __cxa_throw(prVar6,&SBPL_Exception::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                      if (iVar2 == 1) {
                        dVar1 = atof(local_838);
                        (this->EnvNAVXYTHETALATCfg).cellsize_m = dVar1;
                        iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                        if (iVar2 == 1) {
                          builtin_strncpy(local_438,"nominalvel(",0xb);
                          uStack_42d = 0x7265706d;
                          uStack_429 = 0x73;
                          uStack_428 = 0x6365;
                          uStack_426 = 0x3a2973;
                          iVar2 = strcmp(local_438,local_838);
                          if (iVar2 != 0) {
                            std::__cxx11::stringstream::stringstream(local_9c0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_9b0,"ERROR: configuration file has incorrect format",
                                       0x2e);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_9b0," Expected ",10);
                            sVar5 = strlen(local_438);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_9b0,local_438,sVar5);
                            std::__ostream_insert<char,std::char_traits<char>>(local_9b0," got ",5);
                            sVar5 = strlen(local_838);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (local_9b0,local_838,sVar5);
                            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringbuf::str();
                            std::runtime_error::runtime_error(prVar6,asStack_9e8);
                            *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
                            __cxa_throw(prVar6,&SBPL_Exception::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                          if (iVar2 == 1) {
                            dVar1 = atof(local_838);
                            (this->EnvNAVXYTHETALATCfg).nominalvel_mpersecs = dVar1;
                            iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                            if (iVar2 == 1) {
                              uStack_428 = 0x6e69;
                              uStack_426 = 0x63616c70;
                              uStack_422 = 0x65;
                              uStack_421 = 0x28;
                              uStack_420 = 0x3a2973636573;
                              builtin_strncpy(local_438,"timetoturn4",0xb);
                              uStack_42d = 0x67656435;
                              uStack_429 = 0x73;
                              iVar2 = strcmp(local_438,local_838);
                              if (iVar2 != 0) {
                                std::__cxx11::stringstream::stringstream(local_9c0);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (local_9b0,
                                           "ERROR: configuration file has incorrect format",0x2e);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (local_9b0," Expected ",10);
                                sVar5 = strlen(local_438);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (local_9b0,local_438,sVar5);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (local_9b0," got ",5);
                                sVar5 = strlen(local_838);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (local_9b0,local_838,sVar5);
                                prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::__cxx11::stringbuf::str();
                                std::runtime_error::runtime_error(prVar6,asStack_9e8);
                                *(undefined ***)prVar6 = &PTR__runtime_error_001574d0;
                                __cxa_throw(prVar6,&SBPL_Exception::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                              if (iVar2 == 1) {
                                dVar1 = atof(local_838);
                                (this->EnvNAVXYTHETALATCfg).timetoturn45degsinplace_secs = dVar1;
                                iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                if (iVar2 == 1) {
                                  iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                  if (iVar2 == 1) {
                                    dVar1 = atof(local_838);
                                    (this->EnvNAVXYTHETALATCfg).StartX_c =
                                         (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).cellsize_m) -
                                         (uint)(dVar1 < 0.0);
                                    iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                    if (iVar2 == 1) {
                                      dVar1 = atof(local_838);
                                      (this->EnvNAVXYTHETALATCfg).StartY_c =
                                           (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).cellsize_m) -
                                           (uint)(dVar1 < 0.0);
                                      iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                      if (iVar2 == 1) {
                                        dVar1 = atof(local_838);
                                        (this->EnvNAVXYTHETALATCfg).StartTheta_rad = dVar1;
                                        iVar2 = (this->EnvNAVXYTHETALATCfg).StartX_c;
                                        if ((iVar2 < 0) ||
                                           ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <= iVar2)) {
                                          this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10)
                                          ;
                                          SBPL_Exception::SBPL_Exception
                                                    (this_00,"ERROR: illegal start coordinates");
                                        }
                                        else {
                                          iVar2 = (this->EnvNAVXYTHETALATCfg).StartY_c;
                                          if ((iVar2 < 0) ||
                                             ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <= iVar2)) {
                                            this_00 = (SBPL_Exception *)
                                                      __cxa_allocate_exception(0x10);
                                            SBPL_Exception::SBPL_Exception
                                                      (this_00,"ERROR: illegal start coordinates");
                                          }
                                          else {
                                            iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                            if (iVar2 == 1) {
                                              iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                              if (iVar2 == 1) {
                                                dVar1 = atof(local_838);
                                                (this->EnvNAVXYTHETALATCfg).EndX_c =
                                                     (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).
                                                                   cellsize_m) - (uint)(dVar1 < 0.0)
                                                ;
                                                iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                                if (iVar2 == 1) {
                                                  dVar1 = atof(local_838);
                                                  (this->EnvNAVXYTHETALATCfg).EndY_c =
                                                       (int)(dVar1 / (this->EnvNAVXYTHETALATCfg).
                                                                     cellsize_m) -
                                                       (uint)(dVar1 < 0.0);
                                                  iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                                  if (iVar2 == 1) {
                                                    dVar1 = atof(local_838);
                                                    (this->EnvNAVXYTHETALATCfg).EndTheta_rad = dVar1
                                                    ;
                                                    iVar2 = (this->EnvNAVXYTHETALATCfg).EndX_c;
                                                    if ((iVar2 < 0) ||
                                                       ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <=
                                                        iVar2)) {
                                                      this_00 = (SBPL_Exception *)
                                                                __cxa_allocate_exception(0x10);
                                                      SBPL_Exception::SBPL_Exception
                                                                (this_00,
                                                  "ERROR: illegal end coordinates");
                                                  }
                                                  else {
                                                    iVar2 = (this->EnvNAVXYTHETALATCfg).EndY_c;
                                                    if ((iVar2 < 0) ||
                                                       ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <=
                                                        iVar2)) {
                                                      this_00 = (SBPL_Exception *)
                                                                __cxa_allocate_exception(0x10);
                                                      SBPL_Exception::SBPL_Exception
                                                                (this_00,
                                                  "ERROR: illegal end coordinates");
                                                  }
                                                  else {
                                                    if ((this->EnvNAVXYTHETALATCfg).Grid2D !=
                                                        (uchar **)0x0) {
                                                      if (0 < (this->EnvNAVXYTHETALATCfg).EnvWidth_c
                                                         ) {
                                                        lVar9 = 0;
                                                        do {
                                                          puVar4 = (this->EnvNAVXYTHETALATCfg).
                                                                   Grid2D[lVar9];
                                                          if (puVar4 != (uchar *)0x0) {
                                                            operator_delete__(puVar4);
                                                          }
                                                          lVar9 = lVar9 + 1;
                                                        } while (lVar9 < (this->EnvNAVXYTHETALATCfg)
                                                                         .EnvWidth_c);
                                                      }
                                                      ppuVar3 = (this->EnvNAVXYTHETALATCfg).Grid2D;
                                                      if (ppuVar3 != (uchar **)0x0) {
                                                        operator_delete__(ppuVar3);
                                                      }
                                                      (this->EnvNAVXYTHETALATCfg).Grid2D =
                                                           (uchar **)0x0;
                                                    }
                                                    lVar9 = (long)(this->EnvNAVXYTHETALATCfg).
                                                                  EnvWidth_c;
                                                    uVar7 = 0xffffffffffffffff;
                                                    if (-1 < lVar9) {
                                                      uVar7 = lVar9 * 8;
                                                    }
                                                    ppuVar3 = (uchar **)operator_new__(uVar7);
                                                    (this->EnvNAVXYTHETALATCfg).Grid2D = ppuVar3;
                                                    if (0 < lVar9) {
                                                      iVar2 = (this->EnvNAVXYTHETALATCfg).
                                                              EnvHeight_c;
                                                      lVar8 = 0;
                                                      do {
                                                        puVar4 = (uchar *)operator_new__((long)iVar2
                                                                                        );
                                                        (this->EnvNAVXYTHETALATCfg).Grid2D[lVar8] =
                                                             puVar4;
                                                        lVar8 = lVar8 + 1;
                                                      } while (lVar9 != lVar8);
                                                    }
                                                    iVar2 = __isoc99_fscanf(fCfg,"%s",local_838);
                                                    if (iVar2 == 1) {
                                                      if (0 < (this->EnvNAVXYTHETALATCfg).
                                                              EnvHeight_c) {
                                                        lVar9 = 0;
                                                        do {
                                                          if (0 < (this->EnvNAVXYTHETALATCfg).
                                                                  EnvWidth_c) {
                                                            lVar8 = 0;
                                                            do {
                                                              iVar2 = __isoc99_fscanf(fCfg,"%d",
                                                                                      local_9c4);
                                                              if (iVar2 != 1) {
                                                                this_00 = (SBPL_Exception *)
                                                                          __cxa_allocate_exception
                                                                                    (0x10);
                                                                SBPL_Exception::SBPL_Exception
                                                                          (this_00,
                                                  "ERROR: incorrect format of config file");
                                                  goto LAB_00123e64;
                                                  }
                                                  (this->EnvNAVXYTHETALATCfg).Grid2D[lVar8][lVar9] =
                                                       local_9c4[0];
                                                  lVar8 = lVar8 + 1;
                                                  } while (lVar8 < (this->EnvNAVXYTHETALATCfg).
                                                                   EnvWidth_c);
                                                  }
                                                  lVar9 = lVar9 + 1;
                                                  } while (lVar9 < (this->EnvNAVXYTHETALATCfg).
                                                                   EnvHeight_c);
                                                  }
                                                  return;
                                                  }
                                                  this_00 = (SBPL_Exception *)
                                                            __cxa_allocate_exception(0x10);
                                                  SBPL_Exception::SBPL_Exception
                                                            (this_00,
                                                  "ERROR: ran out of env file early");
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    this_00 = (SBPL_Exception *)
                                                              __cxa_allocate_exception(0x10);
                                                    SBPL_Exception::SBPL_Exception
                                                              (this_00,
                                                  "ERROR: ran out of env file early");
                                                  }
                                                }
                                                else {
                                                  this_00 = (SBPL_Exception *)
                                                            __cxa_allocate_exception(0x10);
                                                  SBPL_Exception::SBPL_Exception
                                                            (this_00,
                                                  "ERROR: ran out of env file early");
                                                }
                                              }
                                              else {
                                                this_00 = (SBPL_Exception *)
                                                          __cxa_allocate_exception(0x10);
                                                SBPL_Exception::SBPL_Exception
                                                          (this_00,
                                                  "ERROR: ran out of env file early");
                                              }
                                            }
                                            else {
                                              this_00 = (SBPL_Exception *)
                                                        __cxa_allocate_exception(0x10);
                                              SBPL_Exception::SBPL_Exception
                                                        (this_00,"ERROR: ran out of env file early")
                                              ;
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                        SBPL_Exception::SBPL_Exception
                                                  (this_00,"ERROR: ran out of env file early");
                                      }
                                    }
                                    else {
                                      this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                      SBPL_Exception::SBPL_Exception
                                                (this_00,"ERROR: ran out of env file early");
                                    }
                                  }
                                  else {
                                    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                    SBPL_Exception::SBPL_Exception
                                              (this_00,"ERROR: ran out of env file early");
                                  }
                                }
                                else {
                                  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                  SBPL_Exception::SBPL_Exception
                                            (this_00,"ERROR: ran out of env file early");
                                }
                              }
                              else {
                                this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                                SBPL_Exception::SBPL_Exception
                                          (this_00,"ERROR: ran out of env file early");
                              }
                            }
                            else {
                              this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                              SBPL_Exception::SBPL_Exception
                                        (this_00,"ERROR: ran out of env file early");
                            }
                          }
                          else {
                            this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                            SBPL_Exception::SBPL_Exception
                                      (this_00,"ERROR: ran out of env file early");
                          }
                        }
                        else {
                          this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                          SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early")
                          ;
                        }
                      }
                      else {
                        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                        SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
                      }
                    }
                    else {
                      this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                      SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
                    }
                  }
                  else {
                    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                    SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
                  }
                }
                else {
                  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                  SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
                }
              }
              else {
                this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
                SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
              }
            }
            else {
              this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
              SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
            }
          }
          else {
            this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
          }
        }
        else {
          this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early");
        }
      }
      else {
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early (discretization)");
      }
    }
    else {
      this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early (discretization)");
    }
  }
  else {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,"ERROR: ran out of env file early (discretization)");
  }
LAB_00123e64:
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ReadConfiguration(FILE* fCfg)
{
    // read in the configuration of environment and initialize
    // EnvNAVXYTHETALATCfg structure
    char sTemp[1024], sTemp1[1024];
    int dTemp;
    int x, y;

    // discretization(cells)
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    strcpy(sTemp1, "discretization(cells):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format (discretization)" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvWidth_c = atoi(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early (discretization)");
    }
    EnvNAVXYTHETALATCfg.EnvHeight_c = atoi(sTemp);

    // Scan for optional NumThetaDirs parameter. Check for following obsthresh.
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "NumThetaDirs:");
    if (strcmp(sTemp1, sTemp) != 0) {
        // optional NumThetaDirs not available; default is NAVXYTHETALAT_THETADIRS (16)
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                    " Expected " << sTemp1 << " got " << sTemp;
            throw SBPL_Exception(ss.str());
        }
        else {
            EnvNAVXYTHETALATCfg.NumThetaDirs = NAVXYTHETALAT_THETADIRS;
        }
    }
    else {
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (NumThetaDirs)");
        }
        EnvNAVXYTHETALATCfg.NumThetaDirs = atoi(sTemp);

        //obsthresh:
        if (fscanf(fCfg, "%s", sTemp) != 1) {
            throw SBPL_Exception("ERROR: ran out of env file early (obsthresh)");
        }
        strcpy(sTemp1, "obsthresh:");
        if (strcmp(sTemp1, sTemp) != 0) {
            std::stringstream ss;
            ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
            throw SBPL_Exception(ss.str());
        }
    }

    // obsthresh
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.obsthresh = atoi(sTemp);
    SBPL_PRINTF("obsthresh = %d\n", EnvNAVXYTHETALATCfg.obsthresh);

    //cost_inscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_inscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_inscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_inscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_inscribed_thresh);

    //cost_possibly_circumscribed_thresh:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cost_possibly_circumscribed_thresh:");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp <<
                " see existing examples of env files for the right format of heading";
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh = atoi(sTemp);
    SBPL_PRINTF("cost_possibly_circumscribed_thresh = %d\n", EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh);

    //cellsize
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "cellsize(meters):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.cellsize_m = atof(sTemp);

    //speeds
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "nominalvel(mpersecs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
            " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.nominalvel_mpersecs = atof(sTemp);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    strcpy(sTemp1, "timetoturn45degsinplace(secs):");
    if (strcmp(sTemp1, sTemp) != 0) {
        std::stringstream ss;
        ss << "ERROR: configuration file has incorrect format" <<
                " Expected " << sTemp1 << " got " << sTemp;
        throw SBPL_Exception(ss.str());
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.timetoturn45degsinplace_secs = atof(sTemp);

    // start(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.StartY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.StartTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.StartX_c < 0 ||
        EnvNAVXYTHETALATCfg.StartX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }
    if (EnvNAVXYTHETALATCfg.StartY_c < 0 ||
        EnvNAVXYTHETALATCfg.StartY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal start coordinates");
    }

    // end(meters,rads):
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndX_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    EnvNAVXYTHETALATCfg.EndY_c = CONTXY2DISC(atof(sTemp), EnvNAVXYTHETALATCfg.cellsize_m);
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }

    EnvNAVXYTHETALATCfg.EndTheta_rad = atof(sTemp);

    if (EnvNAVXYTHETALATCfg.EndX_c < 0 ||
        EnvNAVXYTHETALATCfg.EndX_c >= EnvNAVXYTHETALATCfg.EnvWidth_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }
    if (EnvNAVXYTHETALATCfg.EndY_c < 0 ||
        EnvNAVXYTHETALATCfg.EndY_c >= EnvNAVXYTHETALATCfg.EnvHeight_c)
    {
        throw SBPL_Exception("ERROR: illegal end coordinates");
    }

    // unallocate the 2d environment
    if (EnvNAVXYTHETALATCfg.Grid2D != NULL) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            delete[] EnvNAVXYTHETALATCfg.Grid2D[x];
        }
        delete[] EnvNAVXYTHETALATCfg.Grid2D;
        EnvNAVXYTHETALATCfg.Grid2D = NULL;
    }

    // allocate the 2D environment
    EnvNAVXYTHETALATCfg.Grid2D = new unsigned char*[EnvNAVXYTHETALATCfg.EnvWidth_c];
    for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
        EnvNAVXYTHETALATCfg.Grid2D[x] = new unsigned char[EnvNAVXYTHETALATCfg.EnvHeight_c];
    }

    // environment:
    if (fscanf(fCfg, "%s", sTemp) != 1) {
        throw SBPL_Exception("ERROR: ran out of env file early");
    }
    for (y = 0; y < EnvNAVXYTHETALATCfg.EnvHeight_c; y++) {
        for (x = 0; x < EnvNAVXYTHETALATCfg.EnvWidth_c; x++) {
            if (fscanf(fCfg, "%d", &dTemp) != 1) {
                throw SBPL_Exception("ERROR: incorrect format of config file");
            }
            EnvNAVXYTHETALATCfg.Grid2D[x][y] = dTemp;
        }
    }
}